

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O3

void __thiscall deqp::gls::BufferRenderer::render(BufferRenderer *this,deUint32 buffer,int size)

{
  GLenum GVar1;
  GLuint index;
  GLuint index_00;
  TestError *this_00;
  
  glwUseProgram((this->m_program->m_program).m_program);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glUseProgram(m_program->getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                  ,0x182);
  index = glwGetAttribLocation((this->m_program->m_program).m_program,"a_buffer");
  if (index == 0xffffffff) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"bufferLoc != (deUint32)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
               ,0x185);
  }
  else {
    index_00 = glwGetAttribLocation((this->m_program->m_program).m_program,"a_coord");
    if (index_00 != 0xffffffff) {
      if (this->m_vao != 0) {
        glwBindVertexArray(this->m_vao);
        GVar1 = glwGetError();
        glu::checkError(GVar1,"glBindVertexArray(m_vao)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                        ,0x18b);
      }
      glwEnableVertexAttribArray(index);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glEnableVertexAttribArray(bufferLoc)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                      ,0x18d);
      glwEnableVertexAttribArray(index_00);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glEnableVertexAttribArray(coordLoc)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                      ,0x18e);
      glwBindBuffer(0x8892,this->m_coordBuffer);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glBindBuffer(GL_ARRAY_BUFFER, m_coordBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                      ,400);
      glwVertexAttribPointer(index_00,2,0x1406,'\0',0,(void *)0x0);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glVertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, NULL)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                      ,0x191);
      glwBindBuffer(0x8892,buffer);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glBindBuffer(GL_ARRAY_BUFFER, buffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                      ,0x193);
      glwVertexAttribPointer(index,4,0x1401,'\x01',0,(void *)0x0);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glVertexAttribPointer(bufferLoc, 4, GL_UNSIGNED_BYTE, GL_TRUE, 0, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                      ,0x194);
      glwBindBuffer(0x8892,0);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glBindBuffer(GL_ARRAY_BUFFER, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                      ,0x195);
      glwBindBuffer(0x8893,this->m_indexBuffer);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                      ,0x197);
      glwDrawElements(4,6,0x1401,(void *)0x0);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glDrawElements(GL_TRIANGLES, 6, GL_UNSIGNED_BYTE, NULL)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                      ,0x198);
      glwDisableVertexAttribArray(index);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glDisableVertexAttribArray(bufferLoc)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                      ,0x19a);
      glwDisableVertexAttribArray(index_00);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glDisableVertexAttribArray(coordLoc)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                      ,0x19b);
      if (this->m_vao != 0) {
        glwBindVertexArray(0);
        GVar1 = glwGetError();
        glu::checkError(GVar1,"glBindVertexArray(0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                        ,0x19e);
        return;
      }
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"coordLoc != (deUint32)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
               ,0x188);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BufferRenderer::render (deUint32 buffer, int size)
{
	DE_UNREF(size);
	DE_ASSERT((size_t)size >= sizeof(GLubyte) * 4 * 6);
	GLU_CHECK_CALL(glUseProgram(m_program->getProgram()));

	deUint32 bufferLoc = glGetAttribLocation(m_program->getProgram(), "a_buffer");
	TCU_CHECK(bufferLoc != (deUint32)-1);

	deUint32 coordLoc = glGetAttribLocation(m_program->getProgram(), "a_coord");
	TCU_CHECK(coordLoc != (deUint32)-1);

	if (m_vao != 0)
		GLU_CHECK_CALL(glBindVertexArray(m_vao));

	GLU_CHECK_CALL(glEnableVertexAttribArray(bufferLoc));
	GLU_CHECK_CALL(glEnableVertexAttribArray(coordLoc));

	GLU_CHECK_CALL(glBindBuffer(GL_ARRAY_BUFFER, m_coordBuffer));
	GLU_CHECK_CALL(glVertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, NULL));

	GLU_CHECK_CALL(glBindBuffer(GL_ARRAY_BUFFER, buffer));
	GLU_CHECK_CALL(glVertexAttribPointer(bufferLoc, 4, GL_UNSIGNED_BYTE, GL_TRUE, 0, 0));
	GLU_CHECK_CALL(glBindBuffer(GL_ARRAY_BUFFER, 0));

	GLU_CHECK_CALL(glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer));
	GLU_CHECK_CALL(glDrawElements(GL_TRIANGLES, 6, GL_UNSIGNED_BYTE, NULL));

	GLU_CHECK_CALL(glDisableVertexAttribArray(bufferLoc));
	GLU_CHECK_CALL(glDisableVertexAttribArray(coordLoc));

	if (m_vao != 0)
		GLU_CHECK_CALL(glBindVertexArray(0));
}